

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(EpsCopyOutputStream *this,uint8 *ptr)

{
  uint8 *__src;
  uint8 *puVar1;
  uint8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  int size;
  uint local_3c;
  uint8 *local_38;
  
  __src = this->buffer_;
  puVar1 = this->buffer_ + 0x10;
  do {
    if (this->had_error_ == true) {
      return this->buffer_;
    }
    puVar2 = this->end_;
    puVar5 = puVar1;
    puVar6 = __src;
    if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
      this->had_error_ = true;
LAB_002834a2:
      this->end_ = puVar5;
    }
    else {
      if (this->buffer_end_ == (uint8 *)0x0) {
        uVar3 = *(undefined8 *)(puVar2 + 8);
        *(undefined8 *)__src = *(undefined8 *)puVar2;
        *(undefined8 *)(this->buffer_ + 8) = uVar3;
        this->buffer_end_ = puVar2;
        goto LAB_002834a2;
      }
      memcpy(this->buffer_end_,__src,(long)puVar2 - (long)__src);
      do {
        iVar4 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&local_38,&local_3c);
        if ((char)iVar4 == '\0') {
          this->had_error_ = true;
          this->end_ = puVar1;
          goto LAB_002834d7;
        }
      } while ((ulong)local_3c == 0);
      puVar5 = this->end_;
      if ((int)local_3c < 0x11) {
        uVar3 = *(undefined8 *)(puVar5 + 8);
        *(undefined8 *)__src = *(undefined8 *)puVar5;
        *(undefined8 *)(this->buffer_ + 8) = uVar3;
        this->buffer_end_ = local_38;
        puVar5 = __src + (int)local_3c;
        goto LAB_002834a2;
      }
      uVar3 = *(undefined8 *)(puVar5 + 8);
      *(undefined8 *)local_38 = *(undefined8 *)puVar5;
      *(undefined8 *)(local_38 + 8) = uVar3;
      this->end_ = local_38 + ((ulong)local_3c - 0x10);
      this->buffer_end_ = (uint8 *)0x0;
      puVar6 = local_38;
    }
LAB_002834d7:
    ptr = puVar6 + ((int)ptr - (int)puVar2);
    if (ptr < this->end_) {
      return ptr;
    }
  } while( true );
}

Assistant:

uint8* EpsCopyOutputStream::EnsureSpaceFallback(uint8* ptr) {
  do {
    if (PROTOBUF_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    GOOGLE_DCHECK(overrun >= 0);           // NOLINT
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  GOOGLE_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}